

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser_exp1::Run(UnitTest_parser_exp1 *this)

{
  size_type sVar1;
  pointer pSVar2;
  UnitTestBase *this_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_01;
  long lVar3;
  BinaryExpression *bin_exp;
  value_type *exp;
  ExpressionList *exp_list;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> root;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffdb0;
  allocator *paVar4;
  string *in_stack_fffffffffffffdb8;
  long local_230;
  AcceptAST *in_stack_fffffffffffffdd8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffde0;
  allocator *in_stack_fffffffffffffde8;
  UnitTestBase *in_stack_fffffffffffffdf0;
  long local_1f8;
  long local_1d8;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  UnitTestBase *local_90;
  reference local_88;
  allocator local_79;
  string local_78 [40];
  ExpressionList *local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a = 1 + 2 + 3",&local_31);
  anon_unknown.dwarf_4b09::Parse(in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = ASTFind<luna::ExpressionList,AcceptAST>
                       (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  sVar1 = std::
          vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
          ::size(&local_50->exp_list_);
  if (sVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"\'exp_list->exp_list_.size() == 1\'",&local_79);
    UnitTestBase::Error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_88 = std::
             vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ::operator[](&local_50->exp_list_,0);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffdb0);
  if (pSVar2 == (pointer)0x0) {
    local_1d8 = 0;
  }
  else {
    local_1d8 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,
                               0);
  }
  local_90 = (UnitTestBase *)local_1d8;
  if (local_1d8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"\'bin_exp\'",&local_b1);
    UnitTestBase::Error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  if (*(int *)((long)local_90 + 0x30) != 0x2b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"\'bin_exp->op_token_.token_ == \'+\'\'",&local_d9);
    UnitTestBase::Error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffdb0);
  if (pSVar2 == (pointer)0x0) {
    local_1f8 = 0;
  }
  else {
    local_1f8 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (local_1f8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"\'dynamic_cast<luna::Terminator *>(bin_exp->right_.get())\'",&local_101);
    UnitTestBase::Error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffdb0);
  if (pSVar2 == (pointer)0x0) {
    this_00 = (UnitTestBase *)0x0;
  }
  else {
    this_00 = (UnitTestBase *)
              __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,0)
    ;
  }
  local_90 = this_00;
  if (this_00 == (UnitTestBase *)0x0) {
    in_stack_fffffffffffffde8 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"\'bin_exp\'",in_stack_fffffffffffffde8);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  if (*(int *)&(local_90->errors_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != 0x2b) {
    paVar4 = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"\'bin_exp->op_token_.token_ == \'+\'\'",paVar4);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffdb0);
  if (pSVar2 == (pointer)0x0) {
    local_230 = 0;
  }
  else {
    local_230 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (local_230 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_178,"\'dynamic_cast<luna::Terminator *>(bin_exp->left_.get())\'",&local_179);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
  }
  this_01 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                      (in_stack_fffffffffffffdb0);
  if (this_01 == (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(this_01,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (lVar3 == 0) {
    paVar4 = &local_1a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1a0,"\'dynamic_cast<luna::Terminator *>(bin_exp->right_.get())\'",paVar4);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_01);
  return;
}

Assistant:

TEST_CASE(parser_exp1)
{
    auto root = Parse("a = 1 + 2 + 3");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));

    // 1 + 2
    bin_exp = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));
}